

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

void DrawTextCodepoint(Font font,int codepoint,Vector2 position,float fontSize,Color tint)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  long lVar7;
  long lVar8;
  CharInfo *pCVar9;
  float fVar10;
  float fVar11;
  Rectangle source;
  Rectangle dest;
  
  lVar7 = 0x3f;
  if (0 < (long)font.charsCount) {
    lVar8 = 0;
    pCVar9 = font.chars;
    do {
      lVar7 = lVar8;
      if (pCVar9->value == codepoint) break;
      lVar8 = lVar8 + 1;
      pCVar9 = pCVar9 + 1;
      lVar7 = 0x3f;
    } while (font.charsCount != lVar8);
  }
  fVar11 = fontSize / (float)font.baseSize;
  fVar10 = (float)font.charsPadding;
  uVar1 = font.chars[lVar7].offsetX;
  uVar4 = font.chars[lVar7].offsetY;
  dest.x = ((float)(int)uVar1 * fVar11 + position.x) - fVar10 * fVar11;
  dest.y = ((float)(int)uVar4 * fVar11 + position.y) - fVar10 * fVar11;
  uVar2 = font.recs[lVar7].x;
  uVar5 = font.recs[lVar7].y;
  uVar3 = font.recs[lVar7].width;
  uVar6 = font.recs[lVar7].height;
  source.x = (float)uVar2 - fVar10;
  source.y = (float)uVar5 - fVar10;
  source.width = fVar10 + fVar10 + (float)uVar3;
  source.height = fVar10 + fVar10 + (float)uVar6;
  dest.width = fVar11 * source.width;
  dest.height = fVar11 * source.height;
  DrawTexturePro(font.texture,source,dest,(Vector2)0x0,0.0,tint);
  return;
}

Assistant:

void DrawTextCodepoint(Font font, int codepoint, Vector2 position, float fontSize, Color tint)
{
    // Character index position in sprite font
    // NOTE: In case a codepoint is not available in the font, index returned points to '?'
    int index = GetGlyphIndex(font, codepoint);
    float scaleFactor = fontSize/font.baseSize;     // Character quad scaling factor

    // Character destination rectangle on screen
    // NOTE: We consider charsPadding on drawing
    Rectangle dstRec = { position.x + font.chars[index].offsetX*scaleFactor - (float)font.charsPadding*scaleFactor,
                      position.y + font.chars[index].offsetY*scaleFactor - (float)font.charsPadding*scaleFactor,
                      (font.recs[index].width + 2.0f*font.charsPadding)*scaleFactor,
                      (font.recs[index].height + 2.0f*font.charsPadding)*scaleFactor };

    // Character source rectangle from font texture atlas
    // NOTE: We consider chars padding when drawing, it could be required for outline/glow shader effects
    Rectangle srcRec = { font.recs[index].x - (float)font.charsPadding, font.recs[index].y - (float)font.charsPadding,
                         font.recs[index].width + 2.0f*font.charsPadding, font.recs[index].height + 2.0f*font.charsPadding };

    // Draw the character texture on the screen
    DrawTexturePro(font.texture, srcRec, dstRec, (Vector2){ 0, 0 }, 0.0f, tint);
}